

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O1

void yang_print_snode(lyout *out,int level,lys_node *node,int mask)

{
  byte bVar1;
  LYS_NODE LVar2;
  char *__s;
  lys_node *__s_00;
  int iVar3;
  int iVar4;
  lys_module *plVar5;
  lys_module *plVar6;
  char *pcVar7;
  char *pcVar8;
  lys_node *plVar9;
  lys_node *plVar10;
  long lVar11;
  char *pcVar12;
  uint uVar13;
  ulong uVar14;
  LYS_NODE LVar15;
  int iVar16;
  ulong uVar17;
  int local_4c;
  uint uStack_48;
  int flag_1;
  lys_node *local_40;
  int local_34 [2];
  int flag;
  
  uVar14 = (ulong)(uint)level;
  local_40 = node;
  if ((node->nodetype & mask) == LYS_UNKNOWN) goto LAB_001767b9;
  if (((node->nodetype & (LYS_OUTPUT|LYS_INPUT)) != LYS_UNKNOWN) && ((node->flags & 0x40) != 0)) {
    return;
  }
  plVar10 = node->parent;
  if (plVar10 == (lys_node *)0x0) {
LAB_001767a4:
    ly_print(out,"\n");
  }
  else if (plVar10->nodetype == LYS_AUGMENT) {
    if (plVar10->child != node) goto LAB_001767a4;
  }
  else if (node->prev->next != (lys_node *)0x0) goto LAB_001767a4;
LAB_001767b9:
  LVar2 = local_40->nodetype;
  LVar15 = mask & LVar2;
  if (0xff < (int)LVar15) {
    if ((int)LVar15 < 0x800) {
      if (LVar15 != LYS_RPC) {
        if ((LVar15 != LYS_INPUT) && (LVar15 != LYS_OUTPUT)) {
          return;
        }
        ly_print(out,"%*s%s {\n",(ulong)(uint)(level * 2),"");
        iVar16 = level + 1;
        if (local_40->ext_size != 0) {
          yang_print_extension_instances
                    (out,iVar16,local_40->module,LYEXT_SUBSTMT_SELF,'\0',local_40->ext,
                     (uint)local_40->ext_size);
        }
        if (local_40->padding[3] != '\0') {
          lVar11 = 0;
          uVar14 = 0;
          do {
            yang_print_must(out,iVar16,local_40->module,(lys_restr *)(local_40[1].dsc + lVar11));
            uVar14 = uVar14 + 1;
            lVar11 = lVar11 + 0x38;
          } while (uVar14 < local_40->padding[3]);
        }
        if (local_40->padding[2] != '\0') {
          lVar11 = 0;
          uVar14 = 0;
          do {
            yang_print_typedef(out,iVar16,local_40->module,(lys_tpdf *)(local_40[1].name + lVar11));
            uVar14 = uVar14 + 1;
            lVar11 = lVar11 + 0x80;
          } while (uVar14 < local_40->padding[2]);
        }
        plVar9 = local_40;
        for (plVar10 = local_40->child; plVar10 != (lys_node *)0x0; plVar10 = plVar10->next) {
          if (plVar10->parent == plVar9) {
            yang_print_snode(out,iVar16,plVar10,0x800);
            plVar9 = local_40;
          }
        }
        for (plVar10 = plVar9->child; plVar10 != (lys_node *)0x0; plVar10 = plVar10->next) {
          if (plVar10->parent == plVar9) {
            yang_print_snode(out,iVar16,plVar10,0x903f);
            plVar9 = local_40;
          }
        }
        uVar14 = (ulong)(uint)(level * 2);
        goto LAB_0017881b;
      }
    }
    else {
      if ((int)LVar15 < 0x4000) {
        if (LVar15 == LYS_GROUPING) {
          local_34[0] = 0;
          _uStack_48 = uVar14;
          ly_print(out,"%*sgrouping %s",(ulong)(uint)(level * 2),"",local_40->name);
          iVar16 = level + 1;
          yang_print_snode_common(out,iVar16,local_40,local_40->module,local_34,0x71);
          if (local_40->padding[3] != '\0') {
            lVar11 = 0;
            uVar14 = 0;
            do {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(out," {\n");
              }
              yang_print_typedef(out,iVar16,local_40->module,(lys_tpdf *)(local_40[1].name + lVar11)
                                );
              uVar14 = uVar14 + 1;
              lVar11 = lVar11 + 0x80;
            } while (uVar14 < local_40->padding[3]);
          }
          for (plVar10 = local_40->child; plVar10 != (lys_node *)0x0; plVar10 = plVar10->next) {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(out," {\n");
            }
            yang_print_snode(out,iVar16,plVar10,0x800);
          }
          for (plVar10 = local_40->child; plVar10 != (lys_node *)0x0; plVar10 = plVar10->next) {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(out," {\n");
            }
            yang_print_snode(out,iVar16,plVar10,0x903f);
          }
          for (plVar10 = local_40->child; plVar10 != (lys_node *)0x0; plVar10 = plVar10->next) {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(out," {\n");
            }
            yang_print_snode(out,iVar16,plVar10,0x4000);
          }
          for (plVar10 = local_40->child; iVar4 = local_34[0], plVar10 != (lys_node *)0x0;
              plVar10 = plVar10->next) {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(out," {\n");
            }
            yang_print_snode(out,iVar16,plVar10,0x80);
          }
        }
        else {
          if (LVar15 != LYS_USES) {
            return;
          }
          local_4c = 0;
          _uStack_48 = uVar14;
          ly_print(out,"%*suses ",(ulong)(uint)(level * 2),"");
          if (local_40->child != (lys_node *)0x0) {
            plVar5 = lys_node_module(local_40->child);
            plVar6 = lys_node_module(local_40);
            if (plVar6 != plVar5) {
              pcVar12 = transform_module_name2import_prefix(local_40->module,plVar5->name);
              ly_print(out,"%s:",pcVar12);
            }
          }
          ly_print(out,"%s",local_40->name);
          iVar16 = level + 1;
          yang_print_snode_common(out,iVar16,local_40,local_40->module,&local_4c,1);
          if (local_40[1].name != (char *)0x0) {
            if (local_4c == 0) {
              local_4c = 1;
              ly_print(out," {\n");
            }
            yang_print_when(out,iVar16,local_40->module,(lys_when *)local_40[1].name);
          }
          yang_print_snode_common(out,iVar16,local_40,local_40->module,&local_4c,0x72);
          if (local_40->padding[2] != '\0') {
            iVar4 = (int)_uStack_48 + 2;
            uVar14 = 0;
            do {
              if (local_4c == 0) {
                local_4c = 1;
                ly_print(out," {\n");
              }
              plVar5 = local_40->module;
              pcVar12 = local_40[1].dsc;
              lVar11 = uVar14 * 0x50;
              plVar10 = (lys_node *)(pcVar12 + lVar11);
              local_34[0] = 0;
              pcVar7 = transform_json2schema(plVar5,*(char **)(pcVar12 + lVar11));
              ly_print(out,"%*srefine \"%s\"",(ulong)(uint)(iVar16 * 2),"",pcVar7);
              lydict_remove(plVar5->ctx,pcVar7);
              yang_print_snode_common(out,iVar4,plVar10,plVar5,local_34,3);
              if (pcVar12[lVar11 + 0x1e] != '\0') {
                lVar11 = 0;
                uVar17 = 0;
                do {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(out," {\n");
                  }
                  yang_print_must(out,iVar4,plVar5,
                                  (lys_restr *)(*(long *)&plVar10->nodetype + lVar11));
                  uVar17 = uVar17 + 1;
                  lVar11 = lVar11 + 0x38;
                } while (uVar17 < plVar10->padding[2]);
              }
              if (*(short *)plVar10->padding == 1) {
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(out," {\n");
                }
                yang_print_substmt(out,iVar4,LYEXT_SUBSTMT_PRESENCE,'\0',(char *)plVar10->child,
                                   plVar5,plVar10->ext,(uint)plVar10->ext_size);
              }
              if (plVar10->padding[3] != '\0') {
                uVar17 = 0;
                do {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(out," {\n");
                  }
                  yang_print_substmt(out,iVar4,LYEXT_SUBSTMT_DEFAULT,(uint8_t)uVar17,
                                     *(char **)(plVar10->parent->padding + uVar17 * 8 + -0x1c),
                                     plVar5,plVar10->ext,(uint)plVar10->ext_size);
                  uVar17 = uVar17 + 1;
                } while (uVar17 < plVar10->padding[3]);
              }
              if ((plVar10->flags & 1) == 0) {
                if ((plVar10->flags & 2) != 0) {
                  pcVar12 = "false";
                  goto joined_r0x00176ea6;
                }
              }
              else {
                pcVar12 = "true";
joined_r0x00176ea6:
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(out," {\n");
                }
                yang_print_substmt(out,iVar4,LYEXT_SUBSTMT_CONFIG,'\0',pcVar12,plVar5,plVar10->ext,
                                   (uint)plVar10->ext_size);
              }
              if ((plVar10->flags & 0x40) == 0) {
                if ((char)plVar10->flags < '\0') {
                  pcVar12 = "false";
                  goto joined_r0x00176f10;
                }
              }
              else {
                pcVar12 = "true";
joined_r0x00176f10:
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(out," {\n");
                }
                yang_print_substmt(out,iVar4,LYEXT_SUBSTMT_MANDATORY,'\0',pcVar12,plVar5,
                                   plVar10->ext,(uint)plVar10->ext_size);
              }
              if ((plVar10->padding[0] & 0x18) != 0) {
                if ((plVar10->flags & 0x10) != 0) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(out," {\n");
                  }
                  yang_print_unsigned(out,iVar4,LYEXT_SUBSTMT_MIN,'\0',plVar5,plVar10->ext,
                                      (uint)plVar10->ext_size,*(uint *)&plVar10->child);
                }
                if ((plVar10->flags & 8) != 0) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(out," {\n");
                  }
                  uVar13 = *(uint *)((long)&plVar10->child + 4);
                  if (uVar13 == 0) {
                    yang_print_substmt(out,iVar4,LYEXT_SUBSTMT_MAX,'\0',"unbounded",plVar5,
                                       plVar10->ext,(uint)plVar10->ext_size);
                  }
                  else {
                    yang_print_unsigned(out,iVar4,LYEXT_SUBSTMT_MAX,'\0',plVar5,plVar10->ext,
                                        (uint)plVar10->ext_size,uVar13);
                  }
                }
              }
              yang_print_snode_common(out,iVar4,plVar10,plVar5,local_34,0x60);
              yang_print_close(out,iVar16,local_34[0]);
              uVar14 = uVar14 + 1;
            } while (uVar14 < local_40->padding[2]);
          }
          iVar4 = local_4c;
          if (local_40->padding[3] != '\0') {
            lVar11 = 0;
            uVar14 = 0;
            do {
              if (local_4c == 0) {
                local_4c = 1;
                ly_print(out," {\n");
              }
              yang_print_augment(out,iVar16,(lys_node_augment *)(local_40[1].ref + lVar11));
              uVar14 = uVar14 + 1;
              lVar11 = lVar11 + 0x68;
              iVar4 = local_4c;
            } while (uVar14 < local_40->padding[3]);
          }
        }
        goto LAB_00178706;
      }
      if (LVar15 != LYS_ACTION) {
        if (LVar15 != LYS_ANYDATA) {
          return;
        }
        goto LAB_0017722f;
      }
    }
    local_34[0] = 0;
    pcVar12 = "action";
    if (LVar2 == LYS_RPC) {
      pcVar12 = "rpc";
    }
    ly_print(out,"%*s%s %s",(ulong)(uint)(level * 2),"",pcVar12,local_40->name);
    iVar16 = level + 1;
    _uStack_48 = uVar14;
    yang_print_snode_common(out,iVar16,local_40,local_40->module,local_34,0x73);
    if (local_40->padding[3] != '\0') {
      lVar11 = 0;
      uVar14 = 0;
      do {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(out," {\n");
        }
        yang_print_typedef(out,iVar16,local_40->module,(lys_tpdf *)(local_40[1].name + lVar11));
        uVar14 = uVar14 + 1;
        lVar11 = lVar11 + 0x80;
      } while (uVar14 < local_40->padding[3]);
    }
    plVar9 = local_40;
    iVar4 = local_34[0];
    for (plVar10 = local_40->child; local_34[0] = iVar4, plVar10 != (lys_node *)0x0;
        plVar10 = plVar10->next) {
      if ((plVar10->parent == plVar9) &&
         (((plVar10->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN ||
          ((plVar10->flags & 0x40) == 0)))) {
        if (iVar4 == 0) {
          local_34[0] = 1;
          ly_print(out," {\n");
        }
        yang_print_snode(out,iVar16,plVar10,0xe00);
        plVar9 = local_40;
      }
      iVar4 = local_34[0];
    }
    goto LAB_00178706;
  }
  if ((int)LVar15 < 0x10) {
    switch(LVar15) {
    case LYS_CONTAINER:
      local_34[0] = 0;
      ly_print(out,"%*scontainer %s",(ulong)(uint)(level * 2),"",local_40->name);
      iVar16 = level + 1;
      _uStack_48 = uVar14;
      yang_print_snode_common(out,iVar16,local_40,local_40->module,local_34,1);
      if (local_40[1].name != (char *)0x0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(out," {\n");
        }
        yang_print_when(out,iVar16,local_40->module,(lys_when *)local_40[1].name);
      }
      if (local_40->iffeature_size != '\0') {
        lVar11 = 0;
        uVar14 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_iffeature
                    (out,iVar16,local_40->module,
                     (lys_iffeature *)((long)&local_40->iffeature->expr + lVar11));
          uVar14 = uVar14 + 1;
          lVar11 = lVar11 + 0x20;
        } while (uVar14 < local_40->iffeature_size);
      }
      if (local_40->padding[2] != '\0') {
        lVar11 = 0;
        uVar14 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_must(out,iVar16,local_40->module,(lys_restr *)(local_40[1].dsc + lVar11));
          uVar14 = uVar14 + 1;
          lVar11 = lVar11 + 0x38;
        } while (uVar14 < local_40->padding[2]);
      }
      lVar11._0_2_ = local_40[1].flags;
      lVar11._2_1_ = local_40[1].ext_size;
      lVar11._3_1_ = local_40[1].iffeature_size;
      lVar11._4_1_ = local_40[1].padding[0];
      lVar11._5_1_ = local_40[1].padding[1];
      lVar11._6_1_ = local_40[1].padding[2];
      lVar11._7_1_ = local_40[1].padding[3];
      if (lVar11 != 0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(out," {\n");
        }
        yang_print_substmt(out,iVar16,LYEXT_SUBSTMT_PRESENCE,'\0',*(char **)&local_40[1].flags,
                           local_40->module,local_40->ext,(uint)local_40->ext_size);
      }
      yang_print_snode_common(out,iVar16,local_40,local_40->module,local_34,0x74);
      if (local_40->padding[3] != '\0') {
        lVar11 = 0;
        uVar14 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_typedef(out,iVar16,local_40->module,(lys_tpdf *)(local_40[1].ref + lVar11));
          uVar14 = uVar14 + 1;
          lVar11 = lVar11 + 0x80;
        } while (uVar14 < local_40->padding[3]);
      }
      plVar9 = local_40;
      for (plVar10 = local_40->child; plVar10 != (lys_node *)0x0; plVar10 = plVar10->next) {
        if (plVar10->parent == plVar9) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_snode(out,iVar16,plVar10,0x800);
          plVar9 = local_40;
        }
      }
      for (plVar10 = plVar9->child; plVar10 != (lys_node *)0x0; plVar10 = plVar10->next) {
        if (plVar10->parent == plVar9) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_snode(out,iVar16,plVar10,0x903f);
          plVar9 = local_40;
        }
      }
      for (plVar10 = plVar9->child; plVar10 != (lys_node *)0x0; plVar10 = plVar10->next) {
        if (plVar10->parent == plVar9) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_snode(out,iVar16,plVar10,0x4000);
          plVar9 = local_40;
        }
      }
      iVar4 = local_34[0];
      for (plVar10 = plVar9->child; local_34[0] = iVar4, plVar10 != (lys_node *)0x0;
          plVar10 = plVar10->next) {
        if (plVar10->parent == plVar9) {
          if (iVar4 == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_snode(out,iVar16,plVar10,0x80);
          plVar9 = local_40;
        }
        iVar4 = local_34[0];
      }
      break;
    case LYS_CHOICE:
      local_34[0] = 0;
      ly_print(out,"%*schoice %s",(ulong)(uint)(level * 2),"",local_40->name);
      iVar16 = level + 1;
      _uStack_48 = uVar14;
      yang_print_snode_common(out,iVar16,local_40,local_40->module,local_34,1);
      if (local_40[1].name != (char *)0x0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(out," {\n");
        }
        yang_print_when(out,iVar16,local_40->module,(lys_when *)local_40[1].name);
      }
      if (local_40->iffeature_size != '\0') {
        lVar11 = 0;
        uVar14 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_iffeature
                    (out,iVar16,local_40->module,
                     (lys_iffeature *)((long)&local_40->iffeature->expr + lVar11));
          uVar14 = uVar14 + 1;
          lVar11 = lVar11 + 0x20;
        } while (uVar14 < local_40->iffeature_size);
      }
      if (local_40[1].dsc != (char *)0x0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(out," {\n");
        }
        yang_print_substmt(out,iVar16,LYEXT_SUBSTMT_DEFAULT,'\0',*(char **)local_40[1].dsc,
                           local_40->module,local_40->ext,(uint)local_40->ext_size);
      }
      yang_print_snode_common(out,iVar16,local_40,local_40->module,local_34,0x7c);
      plVar9 = local_40;
      iVar4 = local_34[0];
      for (plVar10 = local_40->child; local_34[0] = iVar4, plVar10 != (lys_node *)0x0;
          plVar10 = plVar10->next) {
        if (plVar10->parent == plVar9) {
          if (iVar4 == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_snode(out,iVar16,plVar10,0x807f);
          plVar9 = local_40;
        }
        iVar4 = local_34[0];
      }
      break;
    default:
      goto switchD_001767f6_caseD_3;
    case LYS_LEAF:
      uVar13 = level * 2;
      ly_print(out,"%*sleaf %s {\n",(ulong)uVar13);
      iVar16 = level + 1;
      if (local_40->ext_size != 0) {
        yang_print_extension_instances
                  (out,iVar16,local_40->module,LYEXT_SUBSTMT_SELF,'\0',local_40->ext,
                   (uint)local_40->ext_size);
      }
      if ((lys_when *)local_40[1].name != (lys_when *)0x0) {
        yang_print_when(out,iVar16,local_40->module,(lys_when *)local_40[1].name);
      }
      if (local_40->iffeature_size != '\0') {
        lVar11 = 0;
        uVar14 = 0;
        do {
          yang_print_iffeature
                    (out,iVar16,local_40->module,
                     (lys_iffeature *)((long)&local_40->iffeature->expr + lVar11));
          uVar14 = uVar14 + 1;
          lVar11 = lVar11 + 0x20;
        } while (uVar14 < local_40->iffeature_size);
      }
      yang_print_type(out,iVar16,local_40->module,(lys_type *)&local_40[1].ref);
      yang_print_substmt(out,iVar16,LYEXT_SUBSTMT_UNITS,'\0',(char *)local_40[1].next,
                         local_40->module,local_40->ext,(uint)local_40->ext_size);
      if (local_40->padding[3] != '\0') {
        lVar11 = 0;
        uVar14 = 0;
        do {
          yang_print_must(out,iVar16,local_40->module,(lys_restr *)(local_40[1].dsc + lVar11));
          uVar14 = uVar14 + 1;
          lVar11 = lVar11 + 0x38;
        } while (uVar14 < local_40->padding[3]);
      }
      plVar10 = local_40[1].prev;
      if (plVar10 != (lys_node *)0x0) {
        if ((local_40->flags & 0x800) != 0) {
          _uStack_48 = CONCAT44(flag_1,uVar13);
          pcVar12 = strchr((char *)plVar10,0x3a);
          plVar9 = local_40;
          if (pcVar12 == (char *)0x0) {
            __assert_fail("strchr(leaf->dflt, \':\')",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/printer_yang.c"
                          ,0x461,
                          "void yang_print_leaf(struct lyout *, int, const struct lys_node *)");
          }
          plVar5 = lys_node_module(local_40);
          pcVar12 = plVar5->name;
          __s_00 = plVar9[1].prev;
          pcVar7 = strchr((char *)__s_00,0x3a);
          iVar4 = strncmp((char *)plVar10,pcVar12,(long)pcVar7 - (long)__s_00);
          plVar5 = plVar9->module;
          if (iVar4 == 0) {
            plVar10 = (lys_node *)lydict_insert(plVar5->ctx,pcVar7 + 1,0);
          }
          else {
            plVar10 = (lys_node *)transform_json2schema(plVar5,(char *)__s_00);
          }
          uVar13 = uStack_48;
        }
        yang_print_substmt(out,iVar16,LYEXT_SUBSTMT_DEFAULT,'\0',(char *)plVar10,local_40->module,
                           local_40->ext,(uint)local_40->ext_size);
        if ((local_40->flags & 0x800) != 0) {
          lydict_remove(local_40->module->ctx,(char *)plVar10);
        }
      }
      yang_print_snode_common(out,iVar16,local_40,local_40->module,(int *)0x0,0x7c);
      uVar14 = (ulong)uVar13;
      goto LAB_0017881b;
    case LYS_LEAFLIST:
      ly_print(out,"%*sleaf-list %s {\n");
      uVar13 = level + 1;
      if (local_40->ext_size != 0) {
        yang_print_extension_instances
                  (out,uVar13,local_40->module,LYEXT_SUBSTMT_SELF,'\0',local_40->ext,
                   (uint)local_40->ext_size);
      }
      if ((lys_when *)local_40[1].name != (lys_when *)0x0) {
        yang_print_when(out,uVar13,local_40->module,(lys_when *)local_40[1].name);
      }
      if (local_40->iffeature_size != '\0') {
        lVar11 = 0;
        uVar14 = 0;
        do {
          yang_print_iffeature
                    (out,uVar13,local_40->module,
                     (lys_iffeature *)((long)&local_40->iffeature->expr + lVar11));
          uVar14 = uVar14 + 1;
          lVar11 = lVar11 + 0x20;
        } while (uVar14 < local_40->iffeature_size);
      }
      yang_print_type(out,uVar13,local_40->module,(lys_type *)&local_40[1].ref);
      yang_print_substmt(out,uVar13,LYEXT_SUBSTMT_UNITS,'\0',(char *)local_40[1].next,
                         local_40->module,local_40->ext,(uint)local_40->ext_size);
      if (local_40->padding[3] != '\0') {
        lVar11 = 0;
        uVar14 = 0;
        do {
          yang_print_must(out,uVar13,local_40->module,(lys_restr *)(local_40[1].dsc + lVar11));
          uVar14 = uVar14 + 1;
          lVar11 = lVar11 + 0x38;
        } while (uVar14 < local_40->padding[3]);
      }
      _uStack_48 = (ulong)uVar13;
      if (local_40->padding[2] != '\0') {
        uVar14 = 0;
        do {
          plVar10 = local_40;
          if ((local_40->flags & 0x800) == 0) {
            pcVar12 = *(char **)((local_40[1].prev)->padding + uVar14 * 8 + -0x1c);
          }
          else {
            pcVar12 = *(char **)((local_40[1].prev)->padding + uVar14 * 8 + -0x1c);
            pcVar7 = strchr(pcVar12,0x3a);
            if (pcVar7 == (char *)0x0) {
              __assert_fail("strchr(llist->dflt[i], \':\')",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/printer_yang.c"
                            ,0x4ab,
                            "void yang_print_leaflist(struct lyout *, int, const struct lys_node *)"
                           );
            }
            plVar5 = lys_node_module(plVar10);
            pcVar7 = plVar5->name;
            __s = *(char **)((plVar10[1].prev)->padding + uVar14 * 8 + -0x1c);
            pcVar8 = strchr(__s,0x3a);
            iVar16 = strncmp(pcVar12,pcVar7,(long)pcVar8 - (long)__s);
            if (iVar16 == 0) {
              pcVar12 = lydict_insert(plVar10->module->ctx,pcVar8 + 1,0);
            }
            else {
              pcVar12 = transform_json2schema(plVar10->module,__s);
            }
          }
          yang_print_substmt(out,(int)_uStack_48,LYEXT_SUBSTMT_DEFAULT,(uint8_t)uVar14,pcVar12,
                             local_40->module,local_40->ext,(uint)local_40->ext_size);
          if ((local_40->flags & 0x800) != 0) {
            lydict_remove(local_40->module->ctx,pcVar12);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < local_40->padding[2]);
      }
      iVar16 = (int)_uStack_48;
      yang_print_snode_common(out,iVar16,local_40,local_40->module,(int *)0x0,4);
      if (*(uint *)&local_40[1].priv != 0) {
        yang_print_unsigned(out,iVar16,LYEXT_SUBSTMT_MIN,'\0',local_40->module,local_40->ext,
                            (uint)local_40->ext_size,*(uint *)&local_40[1].priv);
      }
      uVar13 = *(uint *)((long)&local_40[1].priv + 4);
      if (uVar13 != 0) {
        yang_print_unsigned(out,iVar16,LYEXT_SUBSTMT_MAX,'\0',local_40->module,local_40->ext,
                            (uint)local_40->ext_size,uVar13);
      }
      plVar10 = local_40;
      if ((local_40->flags & 0x100) == 0) {
        iVar4 = lys_ext_iter(local_40->ext,local_40->ext_size,'\0',LYEXT_SUBSTMT_ORDEREDBY);
        if (iVar4 != -1) {
          pcVar12 = "system";
          goto LAB_001784a6;
        }
      }
      else {
        pcVar12 = "user";
LAB_001784a6:
        yang_print_substmt(out,iVar16,LYEXT_SUBSTMT_ORDEREDBY,'\0',pcVar12,plVar10->module,
                           plVar10->ext,(uint)plVar10->ext_size);
      }
      yang_print_snode_common(out,iVar16,plVar10,plVar10->module,(int *)0x0,0x70);
      uVar14 = (ulong)(uint)(level * 2);
LAB_0017881b:
      ly_print(out,"%*s}\n",uVar14,"");
      return;
    }
LAB_00178706:
    iVar16 = (int)_uStack_48;
  }
  else {
    if ((int)LVar15 < 0x40) {
      if (LVar15 != LYS_LIST) {
        if (LVar15 != LYS_ANYXML) {
          return;
        }
LAB_0017722f:
        local_34[0] = 0;
        pcVar12 = "anydata";
        if (LVar2 == LYS_ANYXML) {
          pcVar12 = "anyxml";
        }
        ly_print(out,"%*s%s %s",(ulong)(uint)(level * 2),"",pcVar12,local_40->name);
        iVar16 = level + 1;
        _uStack_48 = uVar14;
        yang_print_snode_common(out,iVar16,local_40,local_40->module,local_34,1);
        if (local_40[1].name != (char *)0x0) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_when(out,iVar16,local_40->module,(lys_when *)local_40[1].name);
        }
        if (local_40->iffeature_size != '\0') {
          lVar11 = 0;
          uVar14 = 0;
          do {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(out," {\n");
            }
            yang_print_iffeature
                      (out,iVar16,local_40->module,
                       (lys_iffeature *)((long)&local_40->iffeature->expr + lVar11));
            uVar14 = uVar14 + 1;
            lVar11 = lVar11 + 0x20;
          } while (uVar14 < local_40->iffeature_size);
        }
        if (local_40->padding[3] != '\0') {
          lVar11 = 0;
          uVar14 = 0;
          do {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(out," {\n");
            }
            yang_print_must(out,iVar16,local_40->module,(lys_restr *)(local_40[1].dsc + lVar11));
            uVar14 = uVar14 + 1;
            lVar11 = lVar11 + 0x38;
          } while (uVar14 < local_40->padding[3]);
        }
        yang_print_snode_common(out,iVar16,local_40,local_40->module,local_34,0x7c);
        iVar4 = local_34[0];
        goto LAB_00178706;
      }
      local_34[0] = 0;
      ly_print(out,"%*slist %s",(ulong)(uint)(level * 2),"",local_40->name);
      iVar16 = level + 1;
      _uStack_48 = uVar14;
      yang_print_snode_common(out,iVar16,local_40,local_40->module,local_34,1);
      if (local_40[1].name != (char *)0x0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(out," {\n");
        }
        yang_print_when(out,iVar16,local_40->module,(lys_when *)local_40[1].name);
      }
      if (local_40->iffeature_size != '\0') {
        lVar11 = 0;
        uVar14 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_iffeature
                    (out,iVar16,local_40->module,
                     (lys_iffeature *)((long)&local_40->iffeature->expr + lVar11));
          uVar14 = uVar14 + 1;
          lVar11 = lVar11 + 0x20;
        } while (uVar14 < local_40->iffeature_size);
      }
      if (local_40->padding[0] != '\0') {
        lVar11 = 0;
        uVar14 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_must(out,iVar16,local_40->module,(lys_restr *)(local_40[1].dsc + lVar11));
          uVar14 = uVar14 + 1;
          lVar11 = lVar11 + 0x38;
        } while (uVar14 < local_40->padding[0]);
      }
      if (local_40->padding[2] != '\0') {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(out," {\n");
        }
        yang_print_substmt(out,iVar16,LYEXT_SUBSTMT_KEY,'\0',(char *)local_40[1].module,
                           local_40->module,local_40->ext,(uint)local_40->ext_size);
      }
      if (local_40->padding[3] != '\0') {
        iVar4 = (int)_uStack_48;
        uVar14 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_unique(out,iVar16,(lys_unique *)(local_40[1].ext + uVar14 * 2));
          plVar10 = local_40;
          iVar3 = -1;
          while (iVar3 = lys_ext_iter(plVar10->ext,plVar10->ext_size,(char)iVar3 + '\x01',
                                      LYEXT_SUBSTMT_UNIQUE), iVar3 != -1) {
            if (uVar14 == plVar10->ext[iVar3]->insubstmt_index) {
              ly_print(out," {\n");
              plVar10 = local_40;
              do {
                yang_print_extension_instances
                          (out,iVar4 + 2,plVar10->module,LYEXT_SUBSTMT_UNIQUE,(uint8_t)uVar14,
                           plVar10->ext + iVar3,1);
                plVar10 = local_40;
                do {
                  iVar3 = lys_ext_iter(plVar10->ext,plVar10->ext_size,(char)iVar3 + '\x01',
                                       LYEXT_SUBSTMT_UNIQUE);
                  if (iVar3 == -1) {
                    ly_print(out,"%*s}\n",iVar16 * 2,"");
                    goto LAB_0017828e;
                  }
                } while (uVar14 != plVar10->ext[iVar3]->insubstmt_index);
              } while( true );
            }
          }
          ly_print(out,";\n");
LAB_0017828e:
          uVar14 = uVar14 + 1;
        } while (uVar14 < local_40->padding[3]);
      }
      yang_print_snode_common(out,iVar16,local_40,local_40->module,local_34,4);
      if (*(int *)&local_40[1].iffeature != 0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(out," {\n");
        }
        yang_print_unsigned(out,iVar16,LYEXT_SUBSTMT_MIN,'\0',local_40->module,local_40->ext,
                            (uint)local_40->ext_size,*(uint *)&local_40[1].iffeature);
      }
      if (*(int *)((long)&local_40[1].iffeature + 4) != 0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(out," {\n");
        }
        yang_print_unsigned(out,iVar16,LYEXT_SUBSTMT_MAX,'\0',local_40->module,local_40->ext,
                            (uint)local_40->ext_size,*(uint *)((long)&local_40[1].iffeature + 4));
      }
      plVar10 = local_40;
      if ((local_40->flags & 0x100) == 0) {
        iVar4 = lys_ext_iter(local_40->ext,local_40->ext_size,'\0',LYEXT_SUBSTMT_ORDEREDBY);
        if (iVar4 != -1) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          plVar5 = local_40->module;
          bVar1 = local_40->ext_size;
          pcVar12 = "system";
          goto LAB_0017852d;
        }
      }
      else {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(out," {\n");
        }
        plVar5 = local_40->module;
        bVar1 = local_40->ext_size;
        pcVar12 = "user";
LAB_0017852d:
        plVar10 = local_40;
        yang_print_substmt(out,iVar16,LYEXT_SUBSTMT_ORDEREDBY,'\0',pcVar12,plVar5,local_40->ext,
                           (uint)bVar1);
      }
      yang_print_snode_common(out,iVar16,plVar10,plVar10->module,local_34,0x70);
      if (plVar10->padding[1] != '\0') {
        lVar11 = 0;
        uVar14 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
            plVar10 = local_40;
          }
          yang_print_typedef(out,iVar16,plVar10->module,(lys_tpdf *)(plVar10[1].ref + lVar11));
          uVar14 = uVar14 + 1;
          lVar11 = lVar11 + 0x80;
          plVar10 = local_40;
        } while (uVar14 < local_40->padding[1]);
      }
      for (plVar9 = plVar10->child; plVar9 != (lys_node *)0x0; plVar9 = plVar9->next) {
        if (plVar9->parent == plVar10) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_snode(out,iVar16,plVar9,0x800);
          plVar10 = local_40;
        }
      }
      for (plVar9 = plVar10->child; plVar9 != (lys_node *)0x0; plVar9 = plVar9->next) {
        if (plVar9->parent == plVar10) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_snode(out,iVar16,plVar9,0x983f);
          plVar10 = local_40;
        }
      }
      for (plVar9 = plVar10->child; plVar9 != (lys_node *)0x0; plVar9 = plVar9->next) {
        if (plVar9->parent == plVar10) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_snode(out,iVar16,plVar9,0x4000);
          plVar10 = local_40;
        }
      }
      iVar4 = local_34[0];
      for (plVar9 = plVar10->child; local_34[0] = iVar4, plVar9 != (lys_node *)0x0;
          plVar9 = plVar9->next) {
        if (plVar9->parent == plVar10) {
          if (iVar4 == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_snode(out,iVar16,plVar9,0x80);
          plVar10 = local_40;
        }
        iVar4 = local_34[0];
      }
      goto LAB_00178706;
    }
    if (LVar15 != LYS_CASE) {
      if (LVar15 != LYS_NOTIF) {
        return;
      }
      local_34[0] = 0;
      ly_print(out,"%*snotification %s",(ulong)(uint)(level * 2),"",local_40->name);
      iVar16 = level + 1;
      _uStack_48 = uVar14;
      yang_print_snode_common(out,iVar16,local_40,local_40->module,local_34,3);
      if (local_40->padding[3] != '\0') {
        lVar11 = 0;
        uVar14 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_must(out,iVar16,local_40->module,(lys_restr *)(local_40[1].dsc + lVar11));
          uVar14 = uVar14 + 1;
          lVar11 = lVar11 + 0x38;
        } while (uVar14 < local_40->padding[3]);
      }
      yang_print_snode_common(out,iVar16,local_40,local_40->module,local_34,0x70);
      if (local_40->padding[2] != '\0') {
        lVar11 = 0;
        uVar14 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_typedef(out,iVar16,local_40->module,(lys_tpdf *)(local_40[1].name + lVar11));
          uVar14 = uVar14 + 1;
          lVar11 = lVar11 + 0x80;
        } while (uVar14 < local_40->padding[2]);
      }
      plVar9 = local_40;
      for (plVar10 = local_40->child; plVar10 != (lys_node *)0x0; plVar10 = plVar10->next) {
        if (plVar10->parent == plVar9) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_snode(out,iVar16,plVar10,0x800);
          plVar9 = local_40;
        }
      }
      iVar4 = local_34[0];
      for (plVar10 = plVar9->child; local_34[0] = iVar4, plVar10 != (lys_node *)0x0;
          plVar10 = plVar10->next) {
        if (plVar10->parent == plVar9) {
          if (iVar4 == 0) {
            local_34[0] = 1;
            ly_print(out," {\n");
          }
          yang_print_snode(out,iVar16,plVar10,0x903f);
          plVar9 = local_40;
        }
        iVar4 = local_34[0];
      }
      goto LAB_00178706;
    }
    local_34[0] = 0;
    if ((local_40->flags & 0x40) == 0) {
      ly_print(out,"%*scase %s",(ulong)(uint)(level * 2),"",local_40->name);
      level = level + 1;
      yang_print_snode_common(out,level,local_40,local_40->module,local_34,1);
      if (local_40[1].name != (char *)0x0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(out," {\n");
        }
        yang_print_when(out,level,local_40->module,(lys_when *)local_40[1].name);
      }
      yang_print_snode_common(out,level,local_40,local_40->module,local_34,0x72);
    }
    else {
      local_34[0] = 1;
    }
    plVar9 = local_40;
    iVar4 = local_34[0];
    for (plVar10 = local_40->child; local_34[0] = iVar4, plVar10 != (lys_node *)0x0;
        plVar10 = plVar10->next) {
      if (plVar10->parent == plVar9) {
        if (iVar4 == 0) {
          local_34[0] = 1;
          ly_print(out," {\n");
        }
        yang_print_snode(out,level,plVar10,0x903f);
        plVar9 = local_40;
      }
      iVar4 = local_34[0];
    }
    if ((plVar9->flags & 0x40) != 0) {
      return;
    }
    iVar16 = level + -1;
  }
  yang_print_close(out,iVar16,iVar4);
switchD_001767f6_caseD_3:
  return;
}

Assistant:

static void
yang_print_snode(struct lyout *out, int level, const struct lys_node *node, int mask)
{
    if (node->nodetype & mask) {
        if ((node->nodetype & (LYS_INPUT | LYS_OUTPUT)) && (node->flags & LYS_IMPLICIT)) {
            /* implicit input/output node is not supposed to be printed */
            return;
        } else if (!node->parent ||
                (node->parent->nodetype == LYS_AUGMENT && node != node->parent->child) ||
                (node->parent->nodetype != LYS_AUGMENT && node->prev->next)) {
            /* do not print the blank line before the first data-def node */
            ly_print(out, "\n");
        }
    }

    switch (node->nodetype & mask) {
    case LYS_CONTAINER:
        yang_print_container(out, level, node);
        break;
    case LYS_CHOICE:
        yang_print_choice(out, level, node);
        break;
    case LYS_LEAF:
        yang_print_leaf(out, level, node);
        break;
    case LYS_LEAFLIST:
        yang_print_leaflist(out, level, node);
        break;
    case LYS_LIST:
        yang_print_list(out, level, node);
        break;
    case LYS_USES:
        yang_print_uses(out, level, node);
        break;
    case LYS_GROUPING:
        yang_print_grouping(out, level, node);
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        yang_print_anydata(out, level, node);
        break;
    case LYS_CASE:
        yang_print_case(out, level, node);
        break;
    case LYS_RPC:
    case LYS_ACTION:
        yang_print_rpc_action(out, level, node);
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        yang_print_input_output(out, level, node);
        break;
    case LYS_NOTIF:
        yang_print_notif(out, level, node);
        break;
    default:
        break;
    }
}